

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O3

void __thiscall ON_Light::SetHotSpot(ON_Light *this,double h)

{
  bool bVar1;
  double dVar2;
  
  if (((h == -1.23432101234321e+308) && (!NAN(h))) || (bVar1 = ON_IsValid(h), !bVar1)) {
    dVar2 = -1.23432101234321e+308;
  }
  else {
    if (h <= 0.0) {
      this->m_hotspot = 0.0;
      return;
    }
    if (h < 1.0) {
      this->m_hotspot = h;
      return;
    }
    dVar2 = 1.0;
  }
  this->m_hotspot = dVar2;
  return;
}

Assistant:

void ON_Light::SetHotSpot( double h )
{
  if ( h == ON_UNSET_VALUE || !ON_IsValid(h) )
    m_hotspot = ON_UNSET_VALUE;
  else if ( h <= 0.0 ) 
    m_hotspot = 0.0;
  else if ( h >= 1.0 )
    m_hotspot = 1.0;
  else
    m_hotspot = h;
}